

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Distance<1>::doExpand
          (Distance<1> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<float> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_20;
  
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_20,in_RCX,in_RCX + 1);
  length<1>((Functions *)this,(ExprP<float> *)&local_20);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_20);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return length<Size>(args.a - args.b);
	}